

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if2.c
# Opt level: O0

void t8(int pi)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 in_EDI;
  int v;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  char *pcVar3;
  undefined4 uVar4;
  
  printf("Bank read/write tests.\n");
  gpio_write(in_EDI,0x19,0);
  uVar1 = read_bank_1(in_EDI);
  pcVar3 = (char *)(CONCAT44(in_EDI,uVar1) & 0xffffffff02000000);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,pi,pcVar3);
  uVar4 = (undefined4)((ulong)pcVar3 >> 0x20);
  gpio_write(uVar4,0x19,1);
  uVar1 = read_bank_1(uVar4);
  pcVar3 = (char *)(CONCAT44(uVar4,uVar1) & 0xffffffff02000000);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,pi,pcVar3);
  uVar4 = (undefined4)((ulong)pcVar3 >> 0x20);
  clear_bank_1(uVar4,0x2000000);
  uVar1 = gpio_read(uVar4,0x19);
  pcVar3 = (char *)CONCAT44(uVar4,uVar1);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,pi,pcVar3);
  uVar4 = (undefined4)((ulong)pcVar3 >> 0x20);
  set_bank_1(uVar4,0x2000000);
  uVar1 = gpio_read(uVar4,0x19);
  pcVar3 = (char *)CONCAT44(uVar4,uVar1);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,pi,pcVar3);
  uVar1 = (undefined4)((ulong)pcVar3 >> 0x20);
  iVar2 = read_bank_2(uVar1);
  pcVar3 = (char *)CONCAT44(uVar1,(uint)(iVar2 == 0));
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,pi,pcVar3);
  uVar4 = (undefined4)((ulong)pcVar3 >> 0x20);
  uVar1 = clear_bank_2(uVar4,0);
  pcVar3 = (char *)CONCAT44(uVar4,uVar1);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,pi,pcVar3);
  uVar4 = (undefined4)((ulong)pcVar3 >> 0x20);
  uVar1 = clear_bank_2(uVar4,0xffffff);
  pcVar3 = (char *)CONCAT44(uVar4,uVar1);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,pi,pcVar3);
  uVar4 = (undefined4)((ulong)pcVar3 >> 0x20);
  uVar1 = set_bank_2(uVar4,0);
  pcVar3 = (char *)CONCAT44(uVar4,uVar1);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,pi,pcVar3);
  uVar4 = (undefined4)((ulong)pcVar3 >> 0x20);
  uVar1 = set_bank_2(uVar4,0xffffff);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,pi,
        (char *)CONCAT44(uVar4,uVar1));
  return;
}

Assistant:

void t8(int pi)
{
   int v;

   printf("Bank read/write tests.\n");

   gpio_write(pi, GPIO, 0);
   v = read_bank_1(pi) & (1<<GPIO);
   CHECK(8, 1, v, 0, 0, "read bank 1");

   gpio_write(pi, GPIO, 1);
   v = read_bank_1(pi) & (1<<GPIO);
   CHECK(8, 2, v, (1<<GPIO), 0, "read bank 1");

   clear_bank_1(pi, 1<<GPIO);
   v = gpio_read(pi, GPIO);
   CHECK(8, 3, v, 0, 0, "clear bank 1");

   set_bank_1(pi, 1<<GPIO);
   v = gpio_read(pi, GPIO);
   CHECK(8, 4, v, 1, 0, "set bank 1");

   v = read_bank_2(pi);

   if (v) v = 0; else v = 1;

   CHECK(8, 5, v, 0, 0, "read bank 2");

   v = clear_bank_2(pi, 0);
   CHECK(8, 6, v, 0, 0, "clear bank 2");

   v = clear_bank_2(pi, 0xffffff);
   CHECK(8, 7, v, PI_SOME_PERMITTED, 0, "clear bank 2");

   v = set_bank_2(pi, 0);
   CHECK(8, 8, v, 0, 0, "set bank 2");

   v = set_bank_2(pi, 0xffffff);
   CHECK(8, 9, v, PI_SOME_PERMITTED, 0, "set bank 2");
}